

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateTypeDefinition(ExpressionTranslateContext *ctx,TypeBase *type)

{
  long *plVar1;
  uint uVar2;
  ulong uVar3;
  TypeBase *pTVar4;
  long lVar5;
  long lVar6;
  
  if (type->hasTranslation != false) {
    return;
  }
  type->hasTranslation = true;
  if (type->isGeneric != false) {
    return;
  }
  if ((type == (TypeBase *)0x0) || (pTVar4 = type, type->typeID != 0x15)) {
    pTVar4 = (TypeBase *)0x0;
  }
  if (pTVar4 != (TypeBase *)0x0) {
    Print(ctx,"struct __typeProxy_");
    PrintEscapedName(ctx,pTVar4->name);
    Print(ctx,"{};");
    OutputContext::Print(ctx->output,"\n",1);
    return;
  }
  if ((type == (TypeBase *)0x0) || (pTVar4 = type, type->typeID != 0x13)) {
    pTVar4 = (TypeBase *)0x0;
  }
  if (pTVar4 == (TypeBase *)0x0) {
    if ((type == (TypeBase *)0x0) || (pTVar4 = type, type->typeID != 0x18)) {
      pTVar4 = (TypeBase *)0x0;
    }
    if (pTVar4 == (TypeBase *)0x0) {
      if ((type == (TypeBase *)0x0) || (type->typeID != 0x19)) {
        type = (TypeBase *)0x0;
      }
      if (type != (TypeBase *)0x0) {
        Print(ctx,"struct ");
        PrintEscapedName(ctx,type->name);
        OutputContext::Print(ctx->output,"\n",1);
        PrintIndentedLine(ctx,"{");
        ctx->depth = ctx->depth + 1;
        PrintIndent(ctx);
        PrintEscapedName(ctx,type->name);
        Print(ctx,"(): value(0){}");
        OutputContext::Print(ctx->output,"\n",1);
        PrintIndent(ctx);
        PrintEscapedName(ctx,type->name);
        Print(ctx,"(int v): value(v){}");
        OutputContext::Print(ctx->output,"\n",1);
        PrintIndentedLine(ctx,"int value;");
        goto LAB_00143714;
      }
    }
    else if (((pTVar4->importModule == (ModuleData *)0x0) ||
             (*(char *)((long)&pTVar4[3]._vptr_TypeBase + 1) == '\0')) &&
            (*(char *)&pTVar4[3]._vptr_TypeBase == '\x01')) {
      lVar6._0_4_ = pTVar4[1].typeID;
      lVar6._4_4_ = pTVar4[1].nameHash;
      for (; lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x18)) {
        TranslateTypeDefinition(ctx,*(TypeBase **)(*(long *)(lVar6 + 8) + 0x20));
      }
      uVar3 = 0;
      Print(ctx,"struct ");
      PrintEscapedTypeName(ctx,pTVar4);
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndentedLine(ctx,"{");
      ctx->depth = ctx->depth + 1;
      lVar5._0_4_ = pTVar4[1].typeID;
      lVar5._4_4_ = pTVar4[1].nameHash;
      if (lVar5 != 0) {
        uVar2 = 0;
        uVar3 = 0;
        do {
          if (uVar2 < *(uint *)(*(long *)(lVar5 + 8) + 0x3c)) {
            PrintIndentedLine(ctx,"char pad_%d[%d];",uVar3);
          }
          PrintIndent(ctx);
          TranslateTypeName(ctx,*(TypeBase **)(*(long *)(lVar5 + 8) + 0x20));
          Print(ctx," ");
          TranslateVariableName(ctx,*(VariableData **)(lVar5 + 8));
          Print(ctx,";");
          OutputContext::Print(ctx->output,"\n",1);
          plVar1 = (long *)(lVar5 + 8);
          lVar5 = *(long *)(lVar5 + 0x18);
          uVar2 = *(int *)(*plVar1 + 0x3c) + *(int *)(*(long *)(*plVar1 + 0x20) + 0x30);
          uVar3 = (ulong)((int)uVar3 + 1);
        } while (lVar5 != 0);
      }
      if (pTVar4->padding != 0) {
        PrintIndentedLine(ctx,"char pad_%d[%d];",uVar3);
      }
      goto LAB_00143714;
    }
    return;
  }
  TranslateTypeDefinition(ctx,(TypeBase *)pTVar4[1]._vptr_TypeBase);
  Print(ctx,"struct ");
  PrintEscapedName(ctx,pTVar4->name);
  OutputContext::Print(ctx->output,"\n",1);
  PrintIndentedLine(ctx,"{");
  ctx->depth = ctx->depth + 1;
  PrintIndent(ctx);
  TranslateTypeName(ctx,(TypeBase *)pTVar4[1]._vptr_TypeBase);
  Print(ctx," ptr[%lld];",
        (ulong)(-(*(int *)(pTVar4[1]._vptr_TypeBase + 6) * (int)*(long *)&pTVar4[1].typeID) & 3) +
        *(long *)&pTVar4[1].typeID);
  OutputContext::Print(ctx->output,"\n",1);
  PrintIndent(ctx);
  PrintEscapedName(ctx,pTVar4->name);
  Print(ctx,"& set(unsigned index, ");
  TranslateTypeName(ctx,(TypeBase *)pTVar4[1]._vptr_TypeBase);
  Print(ctx," const& val){ ptr[index] = val; return *this; }");
  OutputContext::Print(ctx->output,"\n",1);
  PrintIndent(ctx);
  TranslateTypeName(ctx,(TypeBase *)pTVar4[1]._vptr_TypeBase);
  Print(ctx,
        "* index(unsigned i){ if(unsigned(i) < %u) return &ptr[i]; nullcThrowError(\"ERROR: array index out of bounds\"); return 0; }"
        ,(ulong)pTVar4[1].typeID);
  OutputContext::Print(ctx->output,"\n",1);
LAB_00143714:
  ctx->depth = ctx->depth - 1;
  PrintIndentedLine(ctx,"};");
  return;
}

Assistant:

void TranslateTypeDefinition(ExpressionTranslateContext &ctx, TypeBase *type)
{
	if(type->hasTranslation)
		return;

	type->hasTranslation = true;

	if(type->isGeneric)
		return;

	if(TypeFunction *typeFunction = getType<TypeFunction>(type))
	{
		Print(ctx, "struct __typeProxy_");
		PrintEscapedName(ctx, typeFunction->name);
		Print(ctx, "{};");
		PrintLine(ctx);
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		TranslateTypeDefinition(ctx, typeArray->subType);

		Print(ctx, "struct ");
		PrintEscapedName(ctx, typeArray->name);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		PrintIndent(ctx);
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, " ptr[%lld];", typeArray->length + ((4 - (typeArray->length * typeArray->subType->size % 4)) & 3)); // Round total byte size to 4
		PrintLine(ctx);

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeArray->name);
		Print(ctx, "& set(unsigned index, ");
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, " const& val){ ptr[index] = val; return *this; }");
		PrintLine(ctx);

		PrintIndent(ctx);
		TranslateTypeName(ctx, typeArray->subType);
		Print(ctx, "* index(unsigned i){ if(unsigned(i) < %u) return &ptr[i]; nullcThrowError(\"ERROR: array index out of bounds\"); return 0; }", (unsigned)typeArray->length);
		PrintLine(ctx);

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(typeClass->importModule && typeClass->isInternal)
			return;

		if(!typeClass->completed)
			return;

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			TranslateTypeDefinition(ctx, curr->variable->type);

		Print(ctx, "struct ");
		PrintEscapedTypeName(ctx, typeClass);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		unsigned offset = 0;
		unsigned index = 0;

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
		{
			if(curr->variable->offset > offset)
				PrintIndentedLine(ctx, "char pad_%d[%d];", index, int(curr->variable->offset - offset));

			PrintIndent(ctx);

			TranslateTypeName(ctx, curr->variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, curr->variable);
			Print(ctx, ";");
			PrintLine(ctx);

			offset = unsigned(curr->variable->offset + curr->variable->type->size);
			index++;
		}

		if(typeClass->padding != 0)
			PrintIndentedLine(ctx, "char pad_%d[%d];", index, typeClass->padding);

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
	else if(TypeEnum *typeEnum = getType<TypeEnum>(type))
	{
		Print(ctx, "struct ");
		PrintEscapedName(ctx, typeEnum->name);
		PrintLine(ctx);

		PrintIndentedLine(ctx, "{");
		ctx.depth++;

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeEnum->name);
		Print(ctx, "(): value(0){}");
		PrintLine(ctx);

		PrintIndent(ctx);
		PrintEscapedName(ctx, typeEnum->name);
		Print(ctx, "(int v): value(v){}");
		PrintLine(ctx);

		PrintIndentedLine(ctx, "int value;");

		ctx.depth--;
		PrintIndentedLine(ctx, "};");
	}
}